

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O2

CURLcode ftp_do_more(Curl_easy *data,int *completep)

{
  uint uVar1;
  connectdata *conn;
  FTP *pFVar2;
  ftpstate newstate;
  _Bool _Var3;
  CURLcode CVar4;
  ulong in_RAX;
  uint5 uStack_38;
  _Bool complete;
  _Bool serv_conned;
  _Bool connected;
  
  conn = data->conn;
  _uStack_38 = in_RAX & 0xffffffffffffff;
  _uStack_38 = (uint6)uStack_38;
  if ((conn->bits).tcpconnect[1] == false) {
    _Var3 = Curl_connect_ongoing(conn);
    if (_Var3) {
      CVar4 = Curl_proxyCONNECT(data,1,(char *)0x0,0);
      return CVar4;
    }
    CVar4 = Curl_is_connected(data,conn,1,&connected);
    if (connected == false) {
      if (CVar4 == CURLE_OK) {
        return CURLE_OK;
      }
      if ((conn->proto).ftpc.count1 == 0) {
        *completep = -1;
        CVar4 = ftp_epsv_disable(data,conn);
        return CVar4;
      }
      return CVar4;
    }
  }
  CVar4 = Curl_proxy_connect(data,1);
  if (CVar4 != CURLE_OK) {
    return CVar4;
  }
  if ((((conn->http_proxy).proxytype == '\x02') && ((conn->bits).proxy_ssl_connected[1] != true)) ||
     (((~*(uint *)&(conn->bits).field_0x4 & 9) == 0 && (_Var3 = Curl_connect_ongoing(conn), _Var3)))
     ) {
    return CURLE_OK;
  }
  pFVar2 = (data->req).p.ftp;
  if ((conn->proto).ftpc.state != FTP_STOP) {
    CVar4 = ftp_multi_statemach(data,&complete);
    *completep = (uint)complete;
    if (CVar4 != CURLE_OK) {
      return CVar4;
    }
    if ((conn->proto).ftpc.wait_data_conn != true) {
      return CURLE_OK;
    }
    *completep = 0;
  }
  if (PPTRANSFER_INFO < pFVar2->transfer) {
    Curl_setup_transfer(data,-1,-1,false,-1);
    if ((conn->proto).ftpc.wait_data_conn == false) {
      *completep = 1;
      return CURLE_OK;
    }
    return CURLE_OK;
  }
  if ((conn->proto).ftpc.wait_data_conn == true) {
    CVar4 = ReceivedServerConnect(data,&serv_conned);
    if (CVar4 != CURLE_OK) {
      return CVar4;
    }
    if (serv_conned != true) {
      return CURLE_OK;
    }
    CVar4 = AcceptServerConnect(data);
    (conn->proto).ftpc.wait_data_conn = false;
    if (CVar4 != CURLE_OK) {
      return CVar4;
    }
    CVar4 = InitiateTransfer(data);
    if (CVar4 == CURLE_OK) {
      *completep = 1;
      return CURLE_OK;
    }
    return CVar4;
  }
  if (((data->set).field_0x8e5 & 4) != 0) {
    CVar4 = ftp_nb_type(data,conn,SUB21((ushort)*(undefined2 *)&(data->state).field_0x6d0 >> 0xf,0),
                        FTP_STOR_TYPE);
    if (CVar4 != CURLE_OK) {
      return CVar4;
    }
    CVar4 = ftp_multi_statemach(data,&complete);
    if ((conn->proto).ftpc.wait_data_conn == true) {
      *completep = 0;
      return CVar4;
    }
    goto LAB_004b199d;
  }
  pFVar2->downloadsize = -1;
  CVar4 = Curl_range(data);
  if (CVar4 == CURLE_OK) {
    if (-1 < (data->req).maxdownload) {
      (conn->proto).ftpc.dont_check = true;
    }
    uVar1 = *(uint *)&(data->state).field_0x6d0;
    if (((uVar1 >> 0x10 & 1) == 0) && ((conn->proto).ftpc.file != (char *)0x0)) {
      _Var3 = SUB41((uVar1 & 0xffff) >> 0xf,0);
      newstate = FTP_RETR_TYPE;
    }
    else {
      if (pFVar2->transfer != PPTRANSFER_BODY) goto LAB_004b1987;
      _Var3 = true;
      newstate = FTP_LIST_TYPE;
    }
    CVar4 = ftp_nb_type(data,conn,_Var3,newstate);
    if (CVar4 != CURLE_OK) {
      return CVar4;
    }
  }
LAB_004b1987:
  CVar4 = ftp_multi_statemach(data,&complete);
LAB_004b199d:
  *completep = (uint)complete;
  return CVar4;
}

Assistant:

static CURLcode ftp_do_more(struct Curl_easy *data, int *completep)
{
  struct connectdata *conn = data->conn;
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  CURLcode result = CURLE_OK;
  bool connected = FALSE;
  bool complete = FALSE;

  /* the ftp struct is inited in ftp_connect(). If we are connecting to an HTTP
   * proxy then the state will not be valid until after that connection is
   * complete */
  struct FTP *ftp = NULL;

  /* if the second connection isn't done yet, wait for it */
  if(!conn->bits.tcpconnect[SECONDARYSOCKET]) {
    if(Curl_connect_ongoing(conn)) {
      /* As we're in TUNNEL_CONNECT state now, we know the proxy name and port
         aren't used so we blank their arguments. */
      result = Curl_proxyCONNECT(data, SECONDARYSOCKET, NULL, 0);

      return result;
    }

    result = Curl_is_connected(data, conn, SECONDARYSOCKET, &connected);

    /* Ready to do more? */
    if(connected) {
      DEBUGF(infof(data, "DO-MORE connected phase starts"));
    }
    else {
      if(result && (ftpc->count1 == 0)) {
        *completep = -1; /* go back to DOING please */
        /* this is a EPSV connect failing, try PASV instead */
        return ftp_epsv_disable(data, conn);
      }
      return result;
    }
  }

#ifndef CURL_DISABLE_PROXY
  result = Curl_proxy_connect(data, SECONDARYSOCKET);
  if(result)
    return result;

  if(CONNECT_SECONDARYSOCKET_PROXY_SSL())
    return result;

  if(conn->bits.tunnel_proxy && conn->bits.httpproxy &&
     Curl_connect_ongoing(conn))
    return result;
#endif

  /* Curl_proxy_connect might have moved the protocol state */
  ftp = data->req.p.ftp;

  if(ftpc->state) {
    /* already in a state so skip the initial commands.
       They are only done to kickstart the do_more state */
    result = ftp_multi_statemach(data, &complete);

    *completep = (int)complete;

    /* if we got an error or if we don't wait for a data connection return
       immediately */
    if(result || !ftpc->wait_data_conn)
      return result;

    /* if we reach the end of the FTP state machine here, *complete will be
       TRUE but so is ftpc->wait_data_conn, which says we need to wait for the
       data connection and therefore we're not actually complete */
    *completep = 0;
  }

  if(ftp->transfer <= PPTRANSFER_INFO) {
    /* a transfer is about to take place, or if not a file name was given
       so we'll do a SIZE on it later and then we need the right TYPE first */

    if(ftpc->wait_data_conn == TRUE) {
      bool serv_conned;

      result = ReceivedServerConnect(data, &serv_conned);
      if(result)
        return result; /* Failed to accept data connection */

      if(serv_conned) {
        /* It looks data connection is established */
        result = AcceptServerConnect(data);
        ftpc->wait_data_conn = FALSE;
        if(!result)
          result = InitiateTransfer(data);

        if(result)
          return result;

        *completep = 1; /* this state is now complete when the server has
                           connected back to us */
      }
    }
    else if(data->set.upload) {
      result = ftp_nb_type(data, conn, data->state.prefer_ascii,
                           FTP_STOR_TYPE);
      if(result)
        return result;

      result = ftp_multi_statemach(data, &complete);
      if(ftpc->wait_data_conn)
        /* if we reach the end of the FTP state machine here, *complete will be
           TRUE but so is ftpc->wait_data_conn, which says we need to wait for
           the data connection and therefore we're not actually complete */
        *completep = 0;
      else
        *completep = (int)complete;
    }
    else {
      /* download */
      ftp->downloadsize = -1; /* unknown as of yet */

      result = Curl_range(data);

      if(result == CURLE_OK && data->req.maxdownload >= 0) {
        /* Don't check for successful transfer */
        ftpc->dont_check = TRUE;
      }

      if(result)
        ;
      else if(data->state.list_only || !ftpc->file) {
        /* The specified path ends with a slash, and therefore we think this
           is a directory that is requested, use LIST. But before that we
           need to set ASCII transfer mode. */

        /* But only if a body transfer was requested. */
        if(ftp->transfer == PPTRANSFER_BODY) {
          result = ftp_nb_type(data, conn, TRUE, FTP_LIST_TYPE);
          if(result)
            return result;
        }
        /* otherwise just fall through */
      }
      else {
        result = ftp_nb_type(data, conn, data->state.prefer_ascii,
                             FTP_RETR_TYPE);
        if(result)
          return result;
      }

      result = ftp_multi_statemach(data, &complete);
      *completep = (int)complete;
    }
    return result;
  }

  /* no data to transfer */
  Curl_setup_transfer(data, -1, -1, FALSE, -1);

  if(!ftpc->wait_data_conn) {
    /* no waiting for the data connection so this is now complete */
    *completep = 1;
    DEBUGF(infof(data, "DO-MORE phase ends with %d", (int)result));
  }

  return result;
}